

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration
                   (string *__return_storage_ptr__,string *extension)

{
  ulong uVar1;
  ostream *poVar2;
  ostringstream local_1a8 [8];
  ostringstream source;
  allocator<char> local_19;
  string *local_18;
  string *extension_local;
  
  local_18 = extension;
  extension_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"#extension ");
    poVar2 = std::operator<<(poVar2,(string *)extension);
    std::operator<<(poVar2," : enable\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderExtensionDeclaration (std::string extension)
{
	if (extension.empty())
		return std::string("");
	else
	{
		std::ostringstream source;
		source << "#extension " << extension << " : enable\n";
		return source.str();
	}
}